

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O2

XXH128_hash_t
XXH3_128bits_internal
          (void *input,size_t len,XXH64_hash_t seed64,void *secret,size_t secretLen,
          XXH3_hashLong128_f f_hl128)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  uint uVar6;
  xxh_u64 xVar7;
  xxh_u64 xVar8;
  long lVar9;
  xxh_u8 *pxVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  xxh_u8 *pxVar14;
  bool bVar15;
  XXH128_hash_t acc;
  XXH128_hash_t acc_00;
  XXH128_hash_t acc_01;
  XXH128_hash_t acc_02;
  XXH128_hash_t XVar16;
  XXH128_hash_t XVar17;
  XXH128_hash_t acc_03;
  
  if (len < 0x11) {
    if (len < 9) {
      if (len < 4) {
        if (len == 0) {
          uVar11 = *(ulong *)((long)secret + 0x50);
          uVar5 = *(ulong *)((long)secret + 0x58);
          xVar8 = XXH64_avalanche(*(ulong *)((long)secret + 0x40) ^ *(ulong *)((long)secret + 0x48)
                                  ^ seed64);
          xVar7 = uVar11 ^ uVar5 ^ seed64;
        }
        else {
          uVar12 = (int)len << 8;
          uVar13 = uVar12 | (uint)*input << 0x10 | (uint)*(byte *)((long)input + (len >> 1)) << 0x18
          ;
          uVar6 = (uint)*(byte *)((long)input + (len - 1));
          uVar12 = uVar13 >> 0x18 | (uVar12 & 0xff0000 | (uint)*input << 0x10) >> 8 |
                   (uVar12 & 0xff00) << 8;
          xVar7 = (ulong)(uVar12 << 0xd | (uVar12 | uVar6 << 0x18) >> 0x13) ^
                  (*(uint *)((long)secret + 0xc) ^ *(uint *)((long)secret + 8)) - seed64;
          xVar8 = XXH64_avalanche((ulong)(uVar13 | uVar6) ^
                                  (*(uint *)((long)secret + 4) ^ *secret) + seed64);
        }
        xVar7 = XXH64_avalanche(xVar7);
      }
      else {
        uVar12 = (uint)seed64;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = (*(ulong *)((long)secret + 0x18) ^ *(ulong *)((long)secret + 0x10)) +
                       ((ulong)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                               uVar12 << 0x18) << 0x20 ^ seed64) ^
                       CONCAT44(*(undefined4 *)((long)input + (len - 4)),*input);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = len * 4 + 0x9e3779b185ebca87;
        uVar5 = SUB168(auVar3 * auVar4,0);
        uVar11 = SUB168(auVar3 * auVar4,8) + uVar5 * 2;
        uVar5 = uVar11 >> 3 ^ uVar5;
        uVar5 = (uVar5 >> 0x23 ^ uVar5) * -0x604de39ae16720db;
        xVar8 = uVar5 >> 0x1c ^ uVar5;
        uVar11 = (uVar11 >> 0x25 ^ uVar11) * 0x165667919e3779f9;
        xVar7 = uVar11 >> 0x20 ^ uVar11;
      }
    }
    else {
      uVar11 = *(ulong *)((long)input + (len - 8));
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (*(ulong *)((long)secret + 0x28) ^ *(ulong *)((long)secret + 0x20)) - seed64 ^
                     *input ^ uVar11;
      uVar11 = (*(ulong *)((long)secret + 0x38) ^ *(ulong *)((long)secret + 0x30)) + seed64 ^ uVar11
      ;
      uVar5 = (uVar11 & 0xffffffff) * 0x85ebca76 + uVar11 +
              SUB168(auVar1 * ZEXT816(0x9e3779b185ebca87),8);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = SUB168(auVar1 * ZEXT816(0x9e3779b185ebca87),0) +
                     (len << 0x36) + -0x40000000000000 ^
                     (uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 |
                      (uVar5 & 0xff0000000000) >> 0x18 | (uVar5 & 0xff00000000) >> 8 |
                      (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
                      (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38);
      uVar11 = SUB168(auVar2 * ZEXT816(0xc2b2ae3d27d4eb4f),0);
      uVar5 = uVar5 * -0x3d4d51c2d82b14b1 + SUB168(auVar2 * ZEXT816(0xc2b2ae3d27d4eb4f),8);
      uVar11 = (uVar11 >> 0x25 ^ uVar11) * 0x165667919e3779f9;
      xVar8 = uVar11 >> 0x20 ^ uVar11;
      uVar11 = (uVar5 >> 0x25 ^ uVar5) * 0x165667919e3779f9;
      xVar7 = uVar11 >> 0x20 ^ uVar11;
    }
  }
  else {
    if (len < 0x81) {
      acc_03.low64 = len * -0x61c8864e7a143579;
      if (len < 0x21) {
        acc_02.high64 = 0;
        acc_02.low64 = acc_03.low64;
      }
      else {
        if (len < 0x41) {
          acc_01.high64 = 0;
          acc_01.low64 = acc_03.low64;
        }
        else {
          if (len < 0x61) {
            acc.high64 = 0;
            acc.low64 = acc_03.low64;
          }
          else {
            acc_03.high64 = 0;
            acc = XXH128_mix32B(acc_03,(xxh_u8 *)((long)input + 0x30),
                                (xxh_u8 *)((long)input + (len - 0x40)),
                                (xxh_u8 *)((long)secret + 0x60),seed64);
          }
          acc_01 = XXH128_mix32B(acc,(xxh_u8 *)((long)input + 0x20),
                                 (xxh_u8 *)((long)input + (len - 0x30)),
                                 (xxh_u8 *)((long)secret + 0x40),seed64);
        }
        acc_02 = XXH128_mix32B(acc_01,(xxh_u8 *)((long)input + 0x10),
                               (xxh_u8 *)((long)input + (len - 0x20)),
                               (xxh_u8 *)((long)secret + 0x20),seed64);
      }
      XVar16 = XXH128_mix32B(acc_02,(xxh_u8 *)input,(xxh_u8 *)((long)input + (len - 0x10)),
                             (xxh_u8 *)secret,seed64);
      uVar11 = XVar16.low64 + XVar16.high64;
      uVar5 = (len - seed64) * -0x3d4d51c2d82b14b1 + XVar16.high64 * -0x7a1435883d4d519d +
              XVar16.low64 * -0x61c8864e7a143579;
    }
    else {
      if (0xf0 < len) {
        XVar16 = (*f_hl128)(input,len,seed64,secret,secretLen);
        return XVar16;
      }
      lVar9 = 4;
      XVar16.high64 = 0;
      XVar16.low64 = len * -0x61c8864e7a143579;
      pxVar10 = (xxh_u8 *)secret;
      pxVar14 = (xxh_u8 *)input;
      while( true ) {
        bVar15 = lVar9 == 0;
        lVar9 = lVar9 + -1;
        if (bVar15) break;
        XVar16 = XXH128_mix32B(XVar16,pxVar14,pxVar14 + 0x10,pxVar10,seed64);
        pxVar10 = pxVar10 + 0x20;
        pxVar14 = pxVar14 + 0x20;
      }
      uVar5 = (XVar16.low64 >> 0x25 ^ XVar16.low64) * 0x165667919e3779f9;
      uVar11 = (XVar16.high64 >> 0x25 ^ XVar16.high64) * 0x165667919e3779f9;
      acc_00.high64 = uVar11 >> 0x20 ^ uVar11;
      acc_00.low64 = uVar5 >> 0x20 ^ uVar5;
      lVar9 = (len >> 5) - 4;
      pxVar10 = (xxh_u8 *)((long)secret + 3);
      pxVar14 = (xxh_u8 *)((long)input + 0x80);
      while (bVar15 = lVar9 != 0, lVar9 = lVar9 + -1, bVar15) {
        acc_00 = XXH128_mix32B(acc_00,pxVar14,pxVar14 + 0x10,pxVar10,seed64);
        pxVar10 = pxVar10 + 0x20;
        pxVar14 = pxVar14 + 0x20;
      }
      XVar16 = XXH128_mix32B(acc_00,(xxh_u8 *)((long)input + (len - 0x10)),
                             (xxh_u8 *)((long)input + (len - 0x20)),(xxh_u8 *)((long)secret + 0x67),
                             -seed64);
      uVar11 = XVar16.low64 + XVar16.high64;
      uVar5 = (len - seed64) * -0x3d4d51c2d82b14b1 + XVar16.high64 * -0x7a1435883d4d519d +
              XVar16.low64 * -0x61c8864e7a143579;
    }
    uVar11 = (uVar11 >> 0x25 ^ uVar11) * 0x165667919e3779f9;
    xVar8 = uVar11 >> 0x20 ^ uVar11;
    uVar11 = (uVar5 >> 0x25 ^ uVar5) * 0x165667919e3779f9;
    xVar7 = -(uVar11 >> 0x20 ^ uVar11);
  }
  XVar17.high64 = xVar7;
  XVar17.low64 = xVar8;
  return XVar17;
}

Assistant:

XXH_FORCE_INLINE XXH128_hash_t
XXH3_128bits_internal(const void* input, size_t len, XXH64_hash_t seed64,
                      const void* XXH_RESTRICT secret, size_t secretLen,
                      XXH3_hashLong128_f f_hl128) {
  XXH_ASSERT(secretLen >= XXH3_SECRET_SIZE_MIN);
  /*
   * If an action is to be taken if `secret` conditions are not respected,
   * it should be done here.
   * For now, it's a contract pre-condition.
   * Adding a check and a branch here would cost performance at every hash.
   */
  if (len <= 16)
    return XXH3_len_0to16_128b((const xxh_u8*)input, len, (const xxh_u8*)secret,
                               seed64);
  if (len <= 128)
    return XXH3_len_17to128_128b((const xxh_u8*)input, len,
                                 (const xxh_u8*)secret, secretLen, seed64);
  if (len <= XXH3_MIDSIZE_MAX)
    return XXH3_len_129to240_128b((const xxh_u8*)input, len,
                                  (const xxh_u8*)secret, secretLen, seed64);
  return f_hl128(input, len, seed64, secret, secretLen);
}